

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSetWithTemplate
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkDescriptorSetLayout layout,
          VkBuffer viewA,deUint32 offsetA,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf,
          bool withPush,VkPipelineLayout pipelineLayout)

{
  RawUpdateRegistry *this_00;
  ShaderInputInterface SVar1;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  VkDescriptorUpdateTemplateEntryKHR updateBinding;
  RefBase<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorBufferInfo bufferInfos [2];
  VkDescriptorUpdateTemplateCreateInfoKHR local_80;
  VkDescriptorBufferInfo resultInfo;
  
  bufferInfos[1].offset = (VkDeviceSize)offsetB;
  resultInfo.buffer = resBuf;
  resultInfo.offset = 0;
  resultInfo.range = 0x40;
  bufferInfos[0].offset = (VkDeviceSize)offsetA;
  bufferInfos[0].range = 0x20;
  bufferInfos[1].range = 0x20;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updateEntries.
  super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_80.pNext = (void *)0x0;
  local_80.flags = 0;
  local_80.descriptorUpdateEntryCount = 0;
  local_80.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_80.templateType = (VkDescriptorUpdateTemplateTypeKHR)withPush;
  local_80.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_80.pipelineLayout.m_internal = pipelineLayout.m_internal;
  local_80.set = 0;
  this_00 = &this->m_updateRegistry;
  bufferInfos[0].buffer.m_internal = viewA.m_internal;
  bufferInfos[1].buffer.m_internal = viewB.m_internal;
  local_80.descriptorSetLayout.m_internal = layout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&resultInfo);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,bufferInfos);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,bufferInfos + 1);
  updateBinding.offset =
       *(this->m_updateRegistry).m_updateEntryOffsets.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  updateBinding.dstBinding = 0;
  updateBinding.dstArrayElement = 0;
  updateBinding.descriptorCount = 1;
  updateBinding.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  updateBinding.stride = 0;
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::push_back(&updateEntries,&updateBinding);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorType = this->m_descriptorType;
    updateBinding.descriptorCount = 1;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorType = this->m_descriptorType;
    updateBinding.descriptorCount = 1;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    updateBinding.dstBinding = 2;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorType = this->m_descriptorType;
    updateBinding.descriptorCount = 1;
    updateBinding.stride = 0;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    updateBinding.offset =
         (this->m_updateRegistry).m_updateEntryOffsets.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    updateBinding.dstBinding = 1;
    updateBinding.dstArrayElement = 0;
    updateBinding.descriptorType = this->m_descriptorType;
    updateBinding.descriptorCount = 2;
    updateBinding.stride = 0x18;
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back(&updateEntries,&updateBinding);
  }
  local_80.pDescriptorUpdateEntries =
       updateEntries.
       super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_80.descriptorUpdateEntryCount =
       (deUint32)
       ((ulong)((long)updateEntries.
                      super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)updateEntries.
                     super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            ((Move<vk::Handle<(vk::HandleType)32>_> *)&local_d8,this->m_vki,this->m_device,&local_80
             ,(VkAllocationCallbacks *)0x0);
  updateBinding.offset = (deUintptr)local_d8.m_data.deleter.m_device;
  updateBinding.stride = (deUintptr)local_d8.m_data.deleter.m_allocator;
  updateBinding.dstBinding = (undefined4)local_d8.m_data.object.m_internal;
  updateBinding.dstArrayElement = local_d8.m_data.object.m_internal._4_4_;
  updateBinding._8_8_ = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::reset
            (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device =
       (VkDevice)updateBinding.offset;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)updateBinding.stride;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal =
       updateBinding._0_8_;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)updateBinding._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::~RefBase(&local_d8);
  if (!withPush) {
    (*this->m_vki->_vptr_DeviceInterface[0x92])
              (this->m_vki,this->m_device,descriptorSet.m_internal,
               (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object
               .m_internal,
               (this->m_updateRegistry).m_updateEntries.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::
  _Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~_Vector_base(&updateEntries.
                   super__Vector_base<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 );
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo						bufferInfos[2]		=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// descriptorUpdateEntryCount
		DE_NULL,	// pDescriptorUpdateEntries
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(bufferInfos[0]);
	m_updateRegistry.addWriteObject(bufferInfos[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), sizeof(bufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries			= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount		= (deUint32)updateEntries.size();

	m_updateTemplate									= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}